

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

CompiledModule * __thiscall
capnp::compiler::Compiler::Impl::addInternal(Impl *this,Module *parsedModule)

{
  Disposer *pDVar1;
  mapped_type *pmVar2;
  CompiledModule *pCVar3;
  Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t> OVar4;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = parsedModule;
  pmVar2 = std::__detail::
           _Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->modules,(key_type *)&local_38);
  pCVar3 = pmVar2->ptr;
  if (pCVar3 == (CompiledModule *)0x0) {
    OVar4 = kj::
            heap<capnp::compiler::Compiler::CompiledModule,capnp::compiler::Compiler::Impl&,capnp::compiler::Module&>
                      ((kj *)&local_38,this,parsedModule);
    pDVar1 = pmVar2->disposer;
    pCVar3 = pmVar2->ptr;
    *(undefined4 *)&pmVar2->disposer = (undefined4)local_38;
    *(undefined4 *)((long)&pmVar2->disposer + 4) = local_38._4_4_;
    *(undefined4 *)&pmVar2->ptr = (undefined4)uStack_30;
    *(undefined4 *)((long)&pmVar2->ptr + 4) = uStack_30._4_4_;
    uStack_30 = 0;
    if (pCVar3 != (CompiledModule *)0x0) {
      (**pDVar1->_vptr_Disposer)(pDVar1,pCVar3,OVar4.ptr);
      if (uStack_30 != 0) {
        uStack_30 = 0;
        (**(local_38->super_ErrorReporter)._vptr_ErrorReporter)();
      }
    }
    pCVar3 = pmVar2->ptr;
  }
  return pCVar3;
}

Assistant:

Compiler::CompiledModule& Compiler::Impl::addInternal(Module& parsedModule) {
  kj::Own<CompiledModule>& slot = modules[&parsedModule];
  if (slot.get() == nullptr) {
    slot = kj::heap<CompiledModule>(*this, parsedModule);
  }

  return *slot;
}